

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::GetAbsoluteTimeout
                    (DWORD dwTimeout,timespec *ptsAbsTmo)

{
  int iVar1;
  PAL_ERROR local_1c;
  int iRet;
  PAL_ERROR palErr;
  timespec *ptsAbsTmo_local;
  DWORD dwTimeout_local;
  
  local_1c = 0;
  iVar1 = clock_gettime(0,(timespec *)ptsAbsTmo);
  if (iVar1 == 0) {
    ptsAbsTmo->tv_sec = (ulong)dwTimeout / 1000 + ptsAbsTmo->tv_sec;
    ptsAbsTmo->tv_nsec = (ulong)((dwTimeout % 1000) * 1000000) + ptsAbsTmo->tv_nsec;
    while (999999999 < ptsAbsTmo->tv_nsec) {
      ptsAbsTmo->tv_sec = ptsAbsTmo->tv_sec + 1;
      ptsAbsTmo->tv_nsec = ptsAbsTmo->tv_nsec + -1000000000;
    }
  }
  else {
    local_1c = 0x54f;
  }
  return local_1c;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetAbsoluteTimeout(DWORD dwTimeout,
                                                 struct timespec * ptsAbsTmo)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet;

#if HAVE_WORKING_CLOCK_GETTIME
        // Not every platform implements a (working) clock_gettime
        iRet = clock_gettime(CLOCK_REALTIME, ptsAbsTmo);
#elif HAVE_WORKING_GETTIMEOFDAY
        // Not every platform implements a (working) gettimeofday
        struct timeval tv;
        iRet = gettimeofday(&tv, NULL);
        if (0 == iRet)
        {
            ptsAbsTmo->tv_sec  = tv.tv_sec;
            ptsAbsTmo->tv_nsec = tv.tv_usec * tccMicroSecondsToNanoSeconds;
        }
#else
        #error "Don't know how to get hi-res current time on this platform"
#endif // HAVE_WORKING_CLOCK_GETTIME, HAVE_WORKING_GETTIMEOFDAY

        if (0 == iRet)
        {
            ptsAbsTmo->tv_sec  += dwTimeout / tccSecondsToMillieSeconds;
            ptsAbsTmo->tv_nsec += (dwTimeout % tccSecondsToMillieSeconds) * tccMillieSecondsToNanoSeconds;
            while (ptsAbsTmo->tv_nsec >= tccSecondsToNanoSeconds)
            {
                ptsAbsTmo->tv_sec  += 1;
                ptsAbsTmo->tv_nsec -= tccSecondsToNanoSeconds;
            }
        }
        else
        {
            palErr = ERROR_INTERNAL_ERROR;
        }

        return palErr;
    }